

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pmulhh_mips64(uint64_t fs,uint64_t ft)

{
  uint local_2c;
  int32_t r;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  _r = ft;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    *(short *)((long)&vt + (ulong)local_2c * 2) =
         (short)((uint)((int)*(short *)((long)&vt + (ulong)local_2c * 2) *
                       (int)*(short *)((long)&r + (ulong)local_2c * 2)) >> 0x10);
  }
  return vt.d;
}

Assistant:

uint64_t helper_pmulhh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int32_t r = vs.sh[i] * vt.sh[i];
        vs.sh[i] = r >> 16;
    }
    return vs.d;
}